

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChMatterSPH.cpp
# Opt level: O1

void __thiscall chrono::ChNodeSPH::ArchiveIN(ChNodeSPH *this,ChArchiveIn *marchive)

{
  ChFunctorArchiveInSpecificPtr<chrono::collision::ChCollisionModel> specFuncA;
  char *local_50;
  double *local_48;
  undefined1 local_40;
  undefined **local_38;
  ChVector<double> *local_30;
  
  ChArchiveIn::VersionRead<chrono::ChNodeSPH>(marchive);
  ChNodeXYZ::ArchiveIN(&this->super_ChNodeXYZ,marchive);
  local_30 = (ChVector<double> *)&this->collision_model;
  local_38 = &PTR__ChFunctorArchiveIn_00b2ce78;
  local_50 = "collision_model";
  local_40 = 0;
  local_48 = (double *)&local_38;
  (**(code **)(*(long *)marchive + 0x68))(marchive,&local_50);
  local_30 = &this->UserForce;
  local_38 = &PTR__ChFunctorArchiveIn_00b2ade0;
  local_50 = "UserForce";
  local_40 = 0;
  local_48 = (double *)&local_38;
  (**(code **)(*(long *)marchive + 0x60))(marchive,&local_50);
  local_48 = &this->volume;
  local_50 = "volume";
  local_40 = 0;
  (**(code **)(*(long *)marchive + 0x20))(marchive,&local_50);
  local_48 = &this->density;
  local_50 = "density";
  local_40 = 0;
  (**(code **)(*(long *)marchive + 0x20))(marchive,&local_50);
  local_48 = &this->h_rad;
  local_50 = "h_rad";
  local_40 = 0;
  (**(code **)(*(long *)marchive + 0x20))(marchive,&local_50);
  local_48 = &this->coll_rad;
  local_50 = "coll_rad";
  local_40 = 0;
  (**(code **)(*(long *)marchive + 0x20))(marchive,&local_50);
  local_48 = &this->pressure;
  local_50 = "pressure";
  local_40 = 0;
  (**(code **)(*(long *)marchive + 0x20))(marchive,&local_50);
  return;
}

Assistant:

void ChNodeSPH::ArchiveIN(ChArchiveIn& marchive) {
    // version number
    /*int version =*/ marchive.VersionRead<ChNodeSPH>();

    // deserialize parent class
    ChNodeXYZ::ArchiveIN(marchive);

    // deserialize all member data:
    // marchive >> CHNVP(container);
    marchive >> CHNVP(collision_model);
    marchive >> CHNVP(UserForce);
    marchive >> CHNVP(volume);
    marchive >> CHNVP(density);
    marchive >> CHNVP(h_rad);
    marchive >> CHNVP(coll_rad);
    marchive >> CHNVP(pressure);
}